

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall
ON_SubD::DeleteComponentsForExperts
          (ON_SubD *this,ON_SubDComponentPtr *cptr_list,size_t cptr_count,bool bDeleteIsolatedEdges,
          bool bUpdateTagsAndCoefficients,bool bMarkDeletedFaceEdges)

{
  bool bVar1;
  Type TVar2;
  uint uVar3;
  uint uVar4;
  ON_SubDimple *this_00;
  ON_SubDComponentBase *pOVar5;
  ON_SubDLevel *pOVar6;
  ON_SubDVertex *this_01;
  ON_SubDEdge *pOVar7;
  ON_SubDFace *pOVar8;
  byte local_1ca;
  byte local_1c9;
  uint deleted_component_count;
  bool bDestroy;
  ON_ComponentStatus local_142;
  ON_SubDComponentPtr local_140;
  ON_SubDComponentPtr cptr_2;
  uint local_130;
  uint deleted_face_count;
  uint deleted_edge_count;
  uint deleted_vertex_count;
  ON_SubDFace *face_2;
  ON_SubDFace *face_1;
  unsigned_short efi;
  ON_SubDEdge *edge_1;
  ON_SubDFace *face;
  unsigned_short vfi;
  ON_SubDEdge *edge;
  unsigned_short vei;
  ON_SubDVertex *vertex;
  ON_SubDComponentBase *c_1;
  ON_SubDComponentPtr cptr_1;
  size_t i_1;
  ON_ComponentStatus local_be [7];
  ON_SubDComponentPtr local_b0;
  ON_SubDComponentPtr cptr;
  ON_SubDComponentIterator cit;
  ON_SubDLevel *level;
  ON_SubDComponentBase *c;
  size_t i;
  uint level_index;
  uint level_count;
  ON_SubDimple *subdimple;
  bool bMarkDeletedFaceEdges_local;
  bool bUpdateTagsAndCoefficients_local;
  bool bDeleteIsolatedEdges_local;
  size_t cptr_count_local;
  ON_SubDComponentPtr *cptr_list_local;
  ON_SubD *this_local;
  
  if (bMarkDeletedFaceEdges) {
    ClearComponentMarks(this,false,true,false,(ON_SimpleArray<const_ON_SubDComponentBase_*> *)0x0);
  }
  if (cptr_count == 0) {
    this_local._7_1_ = true;
  }
  else if (cptr_list == (ON_SubDComponentPtr *)0x0) {
    ON_SubDIncrementErrorCount();
    this_local._7_1_ = false;
  }
  else {
    this_00 = SubDimple(this,false);
    if (this_00 == (ON_SubDimple *)0x0) {
      ON_SubDIncrementErrorCount();
      this_local._7_1_ = false;
    }
    else {
      uVar3 = ON_SubDimple::LevelCount(this_00);
      if (uVar3 == 0) {
        ON_SubDIncrementErrorCount();
        this_local._7_1_ = false;
      }
      else {
        i._0_4_ = uVar3;
        for (c = (ON_SubDComponentBase *)0x0; c < cptr_count;
            c = (ON_SubDComponentBase *)((long)&c->m_subd_point1 + 1)) {
          pOVar5 = ON_SubDComponentPtr::ComponentBase(cptr_list + (long)c);
          if ((pOVar5 != (ON_SubDComponentBase *)0x0) &&
             (uVar4 = ON_SubDComponentBase::SubdivisionLevel(pOVar5), uVar4 < (uint)i)) {
            i._0_4_ = ON_SubDComponentBase::SubdivisionLevel(pOVar5);
          }
        }
        if ((uint)i == uVar3) {
          ON_SubDIncrementErrorCount();
          this_local._7_1_ = false;
        }
        else {
          bVar1 = ON_SubDimple::SetActiveLevel(this_00,(uint)i);
          if (bVar1) {
            ON_SubDimple::ClearHigherSubdivisionLevels(this_00,(uint)i);
            pOVar6 = ON_SubDimple::ActiveLevelPointer(this_00);
            if ((pOVar6 == (ON_SubDLevel *)0x0) || (pOVar6->m_level_index != (uint)i)) {
              ON_SubDIncrementErrorCount();
              this_local._7_1_ = false;
            }
            else {
              ON_SubDComponentIterator::ON_SubDComponentIterator
                        ((ON_SubDComponentIterator *)&cptr,this);
              local_b0 = ON_SubDComponentIterator::FirstComponent((ON_SubDComponentIterator *)&cptr)
              ;
              while (bVar1 = ON_SubDComponentPtr::IsNotNull(&local_b0), bVar1) {
                local_be[0] = ON_SubDComponentPtr::Status(&local_b0);
                bVar1 = ON_ComponentStatus::operator==(&ON_ComponentStatus::AllSet,local_be);
                if (bVar1) {
                  ON_SubDComponentPtr::ClearStates(&local_b0,ON_ComponentStatus::Damaged);
                }
                local_b0 = ON_SubDComponentIterator::NextComponent
                                     ((ON_SubDComponentIterator *)&cptr);
              }
              for (cptr_1.m_ptr = 0; cptr_1.m_ptr < cptr_count; cptr_1.m_ptr = cptr_1.m_ptr + 1) {
                c_1 = (ON_SubDComponentBase *)cptr_list[cptr_1.m_ptr].m_ptr;
                pOVar5 = ON_SubDComponentPtr::ComponentBase((ON_SubDComponentPtr *)&c_1);
                if ((pOVar5 != (ON_SubDComponentBase *)0x0) &&
                   (uVar3 = ON_SubDComponentBase::SubdivisionLevel(pOVar5), uVar3 == (uint)i)) {
                  pOVar5->m_status = ON_ComponentStatus::AllSet;
                  TVar2 = ON_SubDComponentPtr::ComponentType((ON_SubDComponentPtr *)&c_1);
                  switch(TVar2) {
                  case Unset:
                    break;
                  case Vertex:
                    this_01 = ON_SubDComponentPtr::Vertex((ON_SubDComponentPtr *)&c_1);
                    if (this_01 == (ON_SubDVertex *)0x0) goto LAB_0089a7a9;
                    for (edge._6_2_ = 0; edge._6_2_ < this_01->m_edge_count;
                        edge._6_2_ = edge._6_2_ + 1) {
                      pOVar7 = ON_SubDVertex::Edge(this_01,(uint)edge._6_2_);
                      if (pOVar7 != (ON_SubDEdge *)0x0) {
                        (pOVar7->super_ON_SubDComponentBase).m_status = ON_ComponentStatus::AllSet;
                      }
                    }
                    for (face._6_2_ = 0; face._6_2_ < this_01->m_face_count;
                        face._6_2_ = face._6_2_ + 1) {
                      pOVar8 = ON_SubDVertex::Face(this_01,(uint)face._6_2_);
                      if (pOVar8 != (ON_SubDFace *)0x0) {
                        (pOVar8->super_ON_SubDComponentBase).m_status = ON_ComponentStatus::AllSet;
                      }
                    }
                    break;
                  case Edge:
                    pOVar7 = ON_SubDComponentPtr::Edge((ON_SubDComponentPtr *)&c_1);
                    if (pOVar7 == (ON_SubDEdge *)0x0) goto LAB_0089a7a9;
                    (pOVar7->super_ON_SubDComponentBase).m_status = ON_ComponentStatus::AllSet;
                    for (face_1._6_2_ = 0; face_1._6_2_ < pOVar7->m_face_count;
                        face_1._6_2_ = face_1._6_2_ + 1) {
                      pOVar8 = ON_SubDEdge::Face(pOVar7,(uint)face_1._6_2_);
                      if (pOVar8 != (ON_SubDFace *)0x0) {
                        (pOVar8->super_ON_SubDComponentBase).m_status = ON_ComponentStatus::AllSet;
                      }
                    }
                    break;
                  case Face:
                    pOVar8 = ON_SubDComponentPtr::Face((ON_SubDComponentPtr *)&c_1);
                    if (pOVar8 == (ON_SubDFace *)0x0) goto LAB_0089a7a9;
                    (pOVar8->super_ON_SubDComponentBase).m_status = ON_ComponentStatus::AllSet;
                  }
                }
LAB_0089a7a9:
              }
              deleted_face_count = 0;
              local_130 = 0;
              cptr_2.m_ptr._4_4_ = 0;
              local_140 = ON_SubDComponentIterator::FirstComponent
                                    ((ON_SubDComponentIterator *)&cptr);
              while (bVar1 = ON_SubDComponentPtr::IsNotNull(&local_140), bVar1) {
                local_142 = ON_SubDComponentPtr::Status(&local_140);
                bVar1 = ON_ComponentStatus::operator==(&ON_ComponentStatus::AllSet,&local_142);
                if (bVar1) {
                  TVar2 = ON_SubDComponentPtr::ComponentType(&local_140);
                  switch(TVar2) {
                  case Unset:
                    break;
                  case Vertex:
                    deleted_face_count = deleted_face_count + 1;
                    break;
                  case Edge:
                    local_130 = local_130 + 1;
                    break;
                  case Face:
                    cptr_2.m_ptr._4_4_ = cptr_2.m_ptr._4_4_ + 1;
                  }
                }
                local_140 = ON_SubDComponentIterator::NextComponent
                                      ((ON_SubDComponentIterator *)&cptr);
              }
              if (((deleted_face_count == 0) && (local_130 == 0)) && (cptr_2.m_ptr._4_4_ == 0)) {
                this_local._7_1_ = false;
              }
              else {
                local_1c9 = 1;
                if ((deleted_face_count < pOVar6->m_vertex_count) &&
                   (local_1c9 = 1, local_130 < pOVar6->m_edge_count)) {
                  local_1ca = 0;
                  if (pOVar6->m_face_count <= cptr_2.m_ptr._4_4_) {
                    local_1ca = bDeleteIsolatedEdges;
                  }
                  local_1c9 = local_1ca;
                }
                if ((local_1c9 & 1) == 0) {
                  uVar3 = ON_SubDimple::DeleteComponents
                                    (this_00,(uint)i,bDeleteIsolatedEdges,bUpdateTagsAndCoefficients
                                     ,bMarkDeletedFaceEdges);
                  uVar4 = ON_SubDimple::LevelCount(this_00);
                  if (uVar4 == 0) {
                    Destroy(this);
                    this_local._7_1_ = true;
                  }
                  else {
                    if ((uVar3 != 0) || ((uint)i != 0)) {
                      ON_SubDimple::ClearLowerSubdivisionLevels(this_00,(uint)i);
                    }
                    this_local._7_1_ = uVar3 != 0;
                  }
                }
                else {
                  Destroy(this);
                  this_local._7_1_ = true;
                }
              }
              ON_SubDComponentIterator::~ON_SubDComponentIterator((ON_SubDComponentIterator *)&cptr)
              ;
            }
          }
          else {
            ON_SubDIncrementErrorCount();
            this_local._7_1_ = false;
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubD::DeleteComponentsForExperts(
  const ON_SubDComponentPtr* cptr_list,
  size_t cptr_count,
  bool bDeleteIsolatedEdges,
  bool bUpdateTagsAndCoefficients,
  bool bMarkDeletedFaceEdges
)
{
  if (bMarkDeletedFaceEdges)
    ClearComponentMarks(false,true,false,nullptr);

  if ( cptr_count <= 0 )
    return true;

  if ( nullptr == cptr_list )
    return ON_SUBD_RETURN_ERROR(false);

  ON_SubDimple* subdimple = SubDimple(false);
  if ( nullptr == subdimple )
    return ON_SUBD_RETURN_ERROR(false);

  const unsigned int level_count = subdimple->LevelCount();
  if (level_count <= 0)
    return ON_SUBD_RETURN_ERROR(false);
  
  unsigned level_index = level_count;
  for (size_t i = 0; i < cptr_count; i++)
  {
    const ON_SubDComponentBase* c = cptr_list[i].ComponentBase();
    if ( nullptr == c)
      continue;
    if ( c->SubdivisionLevel() < level_index )
      level_index = c->SubdivisionLevel();
  }
  if ( level_index == level_count )
    return ON_SUBD_RETURN_ERROR(false);

  if ( false == subdimple->SetActiveLevel(level_index) )
    return ON_SUBD_RETURN_ERROR(false);

  subdimple->ClearHigherSubdivisionLevels(level_index);
  const ON_SubDLevel* level = subdimple->ActiveLevelPointer();
  if ( nullptr == level || level->m_level_index != level_index)
    return ON_SUBD_RETURN_ERROR(false);

  // Make sure no components have a status = ON_ComponentStatus::AllSet
  // because this uncommon status value is used to mark components that will be be deleted.
  ON_SubDComponentIterator cit(*this);
  for (ON_SubDComponentPtr cptr = cit.FirstComponent(); cptr.IsNotNull(); cptr = cit.NextComponent())
  {
    if ( ON_ComponentStatus::AllSet == cptr.Status() )
      cptr.ClearStates(ON_ComponentStatus::Damaged);
  }

  // Set the status of every component in cptr_list[] to ON_ComponentStatus::AllSet.
  // If that component is a vertex, set the status of every edge and face that
  // touch the vertex to ON_ComponentStatus::AllSet.
  // If that component is an edge, set the status of every face that
  // touches the edge to ON_ComponentStatus::AllSet.
  for (size_t i = 0; i < cptr_count; i++)
  {
    ON_SubDComponentPtr cptr = cptr_list[i];
    const ON_SubDComponentBase* c = cptr.ComponentBase();
    if (nullptr == c)
      continue;
    if (c->SubdivisionLevel() != level_index)
      continue;
    c->m_status = ON_ComponentStatus::AllSet;
    switch (cptr.ComponentType())
    {
    case ON_SubDComponentPtr::Type::Vertex:
      {
        const ON_SubDVertex* vertex = cptr.Vertex();
        if (nullptr == vertex)
          continue;
        for (unsigned short vei = 0; vei < vertex->m_edge_count; vei++)
        {
          const ON_SubDEdge* edge = vertex->Edge(vei);
          if (nullptr == edge)
            continue;
          edge->m_status = ON_ComponentStatus::AllSet;
        }
        for (unsigned short vfi = 0; vfi < vertex->m_face_count; vfi++)
        {
          const ON_SubDFace* face = vertex->Face(vfi);
          if (nullptr == face)
            continue;
          face->m_status = ON_ComponentStatus::AllSet;
        }
      }
      break;

    case ON_SubDComponentPtr::Type::Edge:
      {
        const ON_SubDEdge* edge = cptr.Edge();
        if (nullptr == edge)
          continue;
        edge->m_status = ON_ComponentStatus::AllSet;
        for (unsigned short efi = 0; efi < edge->m_face_count; efi++)
        {
          const ON_SubDFace* face = edge->Face(efi);
          if (nullptr == face)
            continue;
          face->m_status = ON_ComponentStatus::AllSet;
        }
      }
      break;

    case ON_SubDComponentPtr::Type::Face:
      {
        const ON_SubDFace* face = cptr.Face();
        if (nullptr == face)
          continue;
        face->m_status = ON_ComponentStatus::AllSet;
      }
      break;
            
    case ON_SubDComponentPtr::Type::Unset:
      break;
    }
  }

  // Minimum count of what will be deleted. (
  unsigned int deleted_vertex_count = 0;
  unsigned int deleted_edge_count = 0;
  unsigned int deleted_face_count = 0;
  for (ON_SubDComponentPtr cptr = cit.FirstComponent(); cptr.IsNotNull(); cptr = cit.NextComponent())
  {
    if (ON_ComponentStatus::AllSet == cptr.Status())
    {
      switch (cptr.ComponentType())
      {
      case ON_SubDComponentPtr::Type::Vertex:
        deleted_vertex_count++;
        break;

      case ON_SubDComponentPtr::Type::Edge:
        deleted_edge_count++;
        break;

      case ON_SubDComponentPtr::Type::Face:
        deleted_face_count++;
        break;
      case ON_SubDComponentPtr::Type::Unset:
        break;
      }
      continue;
    }
  }

  if ( 0 == deleted_vertex_count && 0 == deleted_edge_count && 0 ==  deleted_face_count )
    return false;

  const bool bDestroy
    = deleted_vertex_count >= level->m_vertex_count
    || deleted_edge_count >= level->m_edge_count
    || (deleted_face_count >= level->m_face_count && bDeleteIsolatedEdges)
    ;
  if (bDestroy)
  {
    Destroy();
    return true;
  }

  unsigned int deleted_component_count = subdimple->DeleteComponents(level_index,bDeleteIsolatedEdges,bUpdateTagsAndCoefficients,bMarkDeletedFaceEdges);

  if (0 == subdimple->LevelCount())
  {
    Destroy();
    return true;
  }

  if (deleted_component_count > 0 || level_index > 0)
  {
    // remove lower levels
    subdimple->ClearLowerSubdivisionLevels(level_index);
  }

  return (deleted_component_count > 0);
}